

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpcfgs.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *this;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  SpecificStrategy *this_00;
  StrategyConfig local_e8;
  _List_node_base local_98;
  undefined8 local_88;
  StrategyConfig local_80;
  
  local_88 = 0;
  this = &local_e8.ranges;
  local_e8._vptr_StrategyConfig = (_func_int **)&PTR__StrategyConfig_00117d60;
  local_e8.compress = false;
  local_e8.detailed = false;
  local_e8.specific = false;
  local_e8.both = false;
  local_98._M_next = &local_98;
  local_98._M_prev = &local_98;
  std::__cxx11::
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::list(this,(list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)&local_98);
  local_e8.dump = (char *)0x0;
  local_e8.input1 = (char *)0x0;
  local_e8.instrs = (char *)0x0;
  local_e8.output = (char *)0x0;
  local_e8.input2 = (char *)0x0;
  p_Var2 = local_98._M_next;
  while (p_Var2 != &local_98) {
    p_Var1 = (((_List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  readoptions(&local_80,argc,argv);
  local_e8.compress = local_80.compress;
  local_e8.detailed = local_80.detailed;
  local_e8.specific = local_80.specific;
  local_e8.both = local_80.both;
  std::__cxx11::
  list<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::_M_assign_dispatch<std::_List_const_iterator<std::pair<unsigned_long,unsigned_long>>>
            ((list<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)this,local_80.ranges.
                     super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next,&local_80.ranges);
  local_80._vptr_StrategyConfig = (_func_int **)&PTR__StrategyConfig_00117d60;
  while (local_80.ranges.
         super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_80.ranges) {
    p_Var2 = (local_80.ranges.
              super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_80.ranges.
                    super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next);
    local_80.ranges.
    super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var2;
  }
  if (local_e8.specific == true) {
    this_00 = (SpecificStrategy *)operator_new(0x268);
    SpecificStrategy::SpecificStrategy(this_00,&local_e8);
  }
  else {
    this_00 = (SpecificStrategy *)operator_new(0x268);
    SimpleStrategy::SimpleStrategy((SimpleStrategy *)this_00,&local_e8);
  }
  (*(this_00->super_Strategy)._vptr_Strategy[2])(this_00);
  (*(this_00->super_Strategy)._vptr_Strategy[1])(this_00);
  local_e8._vptr_StrategyConfig = (_func_int **)&PTR__StrategyConfig_00117d60;
  while (local_e8.ranges.
         super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) {
    p_Var2 = (local_e8.ranges.
              super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_e8.ranges.
                    super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next);
    local_e8.ranges.
    super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var2;
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	StrategyConfig config;
	Strategy* strategy = 0;

	try {
		config = readoptions(argc, argv);
		if (config.specific)
			strategy = new SpecificStrategy(config);
		else
			strategy = new SimpleStrategy(config);

		strategy->process();
	} catch (const std::string& e) {
		std::cerr << e << std::endl;
	}

	if (strategy)
		delete strategy;

	return 0;
}